

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * copy_pf_param(void)

{
  undefined1 local_800 [8];
  vrna_md_t md;
  vrna_exp_param_t *copy;
  
  if (pf.id == pf_id) {
    md.pair[0x14]._76_8_ = vrna_alloc(0x66760);
    memcpy((void *)md.pair[0x14]._76_8_,&pf,0x66760);
    copy = (vrna_exp_param_t *)md.pair[0x14]._76_8_;
  }
  else {
    set_model_details((vrna_md_t *)local_800);
    copy = vrna_exp_params((vrna_md_t *)local_800);
    copy->pf_scale = pf_scale;
  }
  return copy;
}

Assistant:

PUBLIC vrna_exp_param_t *
copy_pf_param(void)
{
  vrna_exp_param_t *copy;

  if (pf.id != pf_id) {
    vrna_md_t md;
    set_model_details(&md);
    copy            = vrna_exp_params(&md);
    copy->pf_scale  = pf_scale;
    return copy;
  } else {
    copy = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
    memcpy(copy, &pf, sizeof(vrna_exp_param_t));
  }

  return copy;
}